

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::emit_header(CompilerMSL *this)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  long lVar6;
  bool bVar7;
  
  if (this->suppress_missing_prototypes == true) {
    CompilerGLSL::statement<char_const(&)[56]>
              (&this->super_CompilerGLSL,
               (char (*) [56])"#pragma clang diagnostic ignored \"-Wmissing-prototypes\"");
  }
  p_Var3 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      bVar7 = (byte)(char)p_Var3[1]._M_color < 0x16;
      if (!bVar7) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar7];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((byte)(char)p_Var5[1]._M_color < 0x17)) {
      CompilerGLSL::statement<char_const(&)[52]>
                (&this->super_CompilerGLSL,
                 (char (*) [52])"#pragma clang diagnostic ignored \"-Wmissing-braces\"");
    }
  }
  for (p_Var4 = (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->pragma_lines)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4)) {
    CompilerGLSL::statement<std::__cxx11::string_const&>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1));
  }
  if (((this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) ||
     (this->suppress_missing_prototypes == true)) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x35713a);
  }
  CompilerGLSL::statement<char_const(&)[24]>
            (&this->super_CompilerGLSL,(char (*) [24])"#include <metal_stdlib>");
  CompilerGLSL::statement<char_const(&)[23]>
            (&this->super_CompilerGLSL,(char (*) [23])"#include <simd/simd.h>");
  sVar2 = (this->super_CompilerGLSL).header_lines.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size;
  if (sVar2 != 0) {
    ts = (this->super_CompilerGLSL).header_lines.
         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .ptr;
    lVar6 = sVar2 << 5;
    do {
      CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,ts);
      ts = ts + 1;
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x35713a);
  CompilerGLSL::statement<char_const(&)[23]>
            (&this->super_CompilerGLSL,(char (*) [23])"using namespace metal;");
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x35713a);
  for (p_Var4 = (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->typedef_lines)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4)) {
    CompilerGLSL::statement<std::__cxx11::string_const&>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1));
  }
  if ((this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    return;
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x35713a);
  return;
}

Assistant:

void CompilerMSL::emit_header()
{
	// This particular line can be overridden during compilation, so make it a flag and not a pragma line.
	if (suppress_missing_prototypes)
		statement("#pragma clang diagnostic ignored \"-Wmissing-prototypes\"");

	// Disable warning about missing braces for array<T> template to make arrays a value type
	if (spv_function_implementations.count(SPVFuncImplUnsafeArray) != 0)
		statement("#pragma clang diagnostic ignored \"-Wmissing-braces\"");

	for (auto &pragma : pragma_lines)
		statement(pragma);

	if (!pragma_lines.empty() || suppress_missing_prototypes)
		statement("");

	statement("#include <metal_stdlib>");
	statement("#include <simd/simd.h>");

	for (auto &header : header_lines)
		statement(header);

	statement("");
	statement("using namespace metal;");
	statement("");

	for (auto &td : typedef_lines)
		statement(td);

	if (!typedef_lines.empty())
		statement("");
}